

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomConnection::write(DomConnection *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QString local_38;
  long local_20;
  
  aVar1._4_4_ = in_register_00000034;
  aVar1._0_4_ = __fd;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = L"connection";
    local_38.d.size = 10;
  }
  else {
    QString::toLower_helper(&local_38);
  }
  QVar2.m_size = (size_t)local_38.d.ptr;
  QVar2.field_0.m_data = aVar1.m_data;
  QXmlStreamWriter::writeStartElement(QVar2);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((this->m_children & 1) != 0) {
    __n = (size_t)(this->m_sender).d.ptr;
    QVar3.m_size = (size_t)L"sender";
    QVar3.field_0.m_data = aVar1.m_data;
    QVar7.m_size = __n;
    QVar7.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar3,QVar7);
  }
  if ((this->m_children & 2) != 0) {
    __n = (size_t)(this->m_signal).d.ptr;
    QVar4.m_size = (size_t)L"signal";
    QVar4.field_0.m_data = aVar1.m_data;
    QVar8.m_size = __n;
    QVar8.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar4,QVar8);
  }
  if ((this->m_children & 4) != 0) {
    __n = (size_t)(this->m_receiver).d.ptr;
    QVar5.m_size = (size_t)L"receiver";
    QVar5.field_0.m_data = aVar1.m_data;
    QVar9.m_size = __n;
    QVar9.field_0.m_data = (void *)0x8000000000000008;
    QXmlStreamWriter::writeTextElement(QVar5,QVar9);
  }
  if ((this->m_children & 8) != 0) {
    __n = (size_t)(this->m_slot).d.ptr;
    QVar6.m_size = (size_t)L"slot";
    QVar6.field_0.m_data = aVar1.m_data;
    QVar10.m_size = __n;
    QVar10.field_0.m_data = (void *)0x8000000000000004;
    QXmlStreamWriter::writeTextElement(QVar6,QVar10);
  }
  if ((this->m_children & 0x10) != 0) {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = L"hints";
    local_38.d.size = 5;
    DomConnectionHints::write(this->m_hints,__fd,&local_38,__n);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomConnection::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("connection") : tagName.toLower());

    if (m_children & Sender)
        writer.writeTextElement(u"sender"_s, m_sender);

    if (m_children & Signal)
        writer.writeTextElement(u"signal"_s, m_signal);

    if (m_children & Receiver)
        writer.writeTextElement(u"receiver"_s, m_receiver);

    if (m_children & Slot)
        writer.writeTextElement(u"slot"_s, m_slot);

    if (m_children & Hints)
        m_hints->write(writer, u"hints"_s);

    writer.writeEndElement();
}